

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor.cpp
# Opt level: O0

void __thiscall
reactor::event_demultiplexer(reactor *this,int *epollfd,epoll_event *events,int *ret,int *listenfd)

{
  int fd_00;
  int local_34;
  int fd;
  int i;
  int *listenfd_local;
  int *ret_local;
  epoll_event *events_local;
  int *epollfd_local;
  reactor *this_local;
  
  for (local_34 = 0; local_34 < *ret; local_34 = local_34 + 1) {
    fd_00 = events[local_34].data.fd;
    if ((fd_00 == *listenfd) && ((events[local_34].events & 1) != 0)) {
      listen_handle(this,epollfd,fd_00);
    }
    else if ((events[local_34].events & 1) == 0) {
      if ((events[local_34].events & 4) != 0) {
        write_handle(this,epollfd,fd_00);
      }
    }
    else {
      read_handle(this,epollfd,fd_00);
    }
  }
  return;
}

Assistant:

void reactor::event_demultiplexer(const int &epollfd,struct epoll_event *events,const int &ret,const int &listenfd){
    int i,fd;
    for(i=0;i<ret;i++){
        fd=events[i].data.fd;
        if((fd==listenfd)&&events[i].events&EPOLLIN)
            reactor::listen_handle(epollfd,fd);
        else if(events[i].events&EPOLLIN)
            reactor::read_handle(epollfd,fd);
        else if(events[i].events&EPOLLOUT)
            reactor::write_handle(epollfd,fd);
    }
}